

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O2

void MARGINAL::update_marginal(data *sm,example *ec)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  byte bVar6;
  float *pfVar7;
  loss_function *plVar8;
  vw *pvVar9;
  uint64_t *puVar10;
  mapped_type *pmVar11;
  mapped_type *pmVar12;
  uint64_t uVar13;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this;
  float *pfVar14;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar15;
  float fVar16;
  uint64_t key;
  key_type local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  features *local_a0;
  byte *local_98;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_90;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_88;
  uint64_t local_80;
  vw *local_78;
  double local_70;
  features *local_68;
  ulong *local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  
  local_78 = sm->all;
  puVar10 = &(local_78->weights).dense_weights._weight_mask;
  if ((local_78->weights).sparse != false) {
    puVar10 = &(local_78->weights).sparse_weights._weight_mask;
  }
  if (sm->unweighted_marginals == false) {
    local_58 = ec->weight;
  }
  else {
    local_58 = 1.0;
  }
  uVar13 = *puVar10;
  fVar1 = (ec->l).simple.label;
  local_a0 = sm->temp;
  this = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          *)&sm->marginals;
  local_90 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&sm->expert_state;
  local_70 = (double)local_58;
  local_48 = ZEXT416((uint)local_58);
  local_88 = this;
  local_80 = uVar13;
  fStack_54 = local_58;
  fStack_50 = local_58;
  fStack_4c = local_58;
  for (local_98 = (ec->super_example_predict).indices._begin;
      local_98 != (ec->super_example_predict).indices._end; local_98 = local_98 + 1) {
    bVar6 = *local_98;
    if (sm->id_features[bVar6] == true) {
      local_68 = local_a0 + bVar6;
      local_60 = local_a0[bVar6].indicies._begin + 1;
      for (pfVar14 = local_a0[bVar6].values._begin;
          (pfVar7 = (local_68->values)._end, pfVar14 != pfVar7 && (pfVar14 + 1 != pfVar7));
          pfVar14 = pfVar14 + 2) {
        local_d0 = (*local_60 & uVar13) + (ec->super_example_predict).ft_offset;
        pmVar11 = std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[](this,&local_d0);
        if (sm->compete == true) {
          pmVar12 = std::__detail::
                    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[](local_90,&local_d0);
          pvVar9 = local_78;
          local_c8 = ZEXT416((uint)sm->alg_loss);
          (*local_78->loss->_vptr_loss_function[1])
                    ((float)(pmVar11->first / pmVar11->second),fVar1,local_78->loss,local_78->sd);
          this = local_88;
          local_c8._0_4_ = (float)local_c8._0_4_ - extraout_XMM0_Da;
          local_b8 = ZEXT416((uint)sm->alg_loss);
          plVar8 = pvVar9->loss;
          (*plVar8->_vptr_loss_function[1])(sm->feature_pred,fVar1,plVar8,pvVar9->sd);
          local_b8._0_4_ = (float)local_b8._0_4_ - extraout_XMM0_Da_00;
          uVar2 = (pmVar12->first).regret;
          uVar4 = (pmVar12->first).abs_regret;
          fVar15 = (float)local_c8._0_4_ * local_58 + (float)uVar2;
          fVar16 = (float)local_c8._0_4_ * (float)local_c8._0_4_ * fStack_54 + (float)uVar4;
          (pmVar12->first).regret = fVar15;
          (pmVar12->first).abs_regret = fVar16;
          fVar15 = get_adanormalhedge_weights(fVar15,fVar16);
          (pmVar12->first).weight = fVar15;
          uVar3 = (pmVar12->second).regret;
          uVar5 = (pmVar12->second).abs_regret;
          fVar15 = (float)local_b8._0_4_ * local_58 + (float)uVar3;
          fVar16 = (float)local_b8._0_4_ * (float)local_b8._0_4_ * fStack_54 + (float)uVar5;
          (pmVar12->second).regret = fVar15;
          (pmVar12->second).abs_regret = fVar16;
          fVar15 = get_adanormalhedge_weights(fVar15,fVar16);
          (pmVar12->second).weight = fVar15;
          uVar13 = local_80;
        }
        pmVar11->first =
             (1.0 - (double)sm->decay) * pmVar11->first +
             (double)((ec->l).simple.label * (float)local_48._0_4_);
        pmVar11->second = (1.0 - (double)sm->decay) * pmVar11->second + local_70;
        local_60 = local_60 + 2;
      }
    }
  }
  return;
}

Assistant:

void update_marginal(data& sm, example& ec)
{
  vw& all = *sm.all;
  uint64_t mask = sm.all->weights.mask();
  float label = ec.l.simple.label;
  float weight = ec.weight;
  if (sm.unweighted_marginals)
    weight = 1.;

  for (example::iterator i = ec.begin(); i != ec.end(); ++i)
  {
    namespace_index n = i.index();
    if (sm.id_features[n])
      for (features::iterator j = sm.temp[n].begin(); j != sm.temp[n].end(); ++j)
      {
        if (++j == sm.temp[n].end())
          break;

        uint64_t second_index = j.index() & mask;
        uint64_t key = second_index + ec.ft_offset;
        marginal& m = sm.marginals[key];

        if (sm.compete)  // now update weights, before updating marginals
        {
          expert_pair& e = sm.expert_state[key];
          float regret1 = sm.alg_loss - all.loss->getLoss(all.sd, (float)(m.first / m.second), label);
          float regret2 = sm.alg_loss - all.loss->getLoss(all.sd, sm.feature_pred, label);

          e.first.regret += regret1 * weight;
          e.first.abs_regret += regret1 * regret1 * weight;  // fabs(regret1);
          e.first.weight = get_adanormalhedge_weights(e.first.regret, e.first.abs_regret);
          e.second.regret += regret2 * weight;
          e.second.abs_regret += regret2 * regret2 * weight;  // fabs(regret2);
          e.second.weight = get_adanormalhedge_weights(e.second.regret, e.second.abs_regret);
        }

        m.first = m.first * (1. - sm.decay) + ec.l.simple.label * weight;
        m.second = m.second * (1. - sm.decay) + weight;
      }
  }
}